

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message ** __thiscall
google::protobuf::Reflection::MutableField<google::protobuf::Message*>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Message **ppMVar2;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (bVar1) {
    SetOneofCase(this,message,field);
  }
  else {
    SetHasBit(this,message,field);
  }
  ppMVar2 = MutableRaw<google::protobuf::Message*>(this,message,field);
  return ppMVar2;
}

Assistant:

Type* Reflection::MutableField(Message* message,
                               const FieldDescriptor* field) const {
  schema_.InRealOneof(field) ? SetOneofCase(message, field)
                             : SetHasBit(message, field);
  return MutableRaw<Type>(message, field);
}